

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftpserver.c
# Opt level: O0

void uss_close(SftpServer *srv,SftpReplyBuilder *reply,ptrlen handle)

{
  int __fd;
  uss_dirhandle *e;
  uss_dirhandle *udh;
  int fd;
  UnixSftpServer *uss;
  SftpReplyBuilder *reply_local;
  SftpServer *srv_local;
  ptrlen handle_local;
  
  e = uss_try_lookup_dirhandle((UnixSftpServer *)(srv + -6),handle);
  if (e == (uss_dirhandle *)0x0) {
    __fd = uss_lookup_fd((UnixSftpServer *)(srv + -6),reply,handle);
    if (-1 < __fd) {
      close(__fd);
      if ((__fd < 0) || (srv[-4].vt < (SftpServerVtable *)(long)__fd)) {
        __assert_fail("0 <= fd && fd <= uss->fdsize",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/sftpserver.c"
                      ,0x11d,"void uss_close(SftpServer *, SftpReplyBuilder *, ptrlen)");
      }
      *(undefined1 *)((long)&(srv[-5].vt)->new + (long)__fd) = 0;
      fxp_reply_ok(reply);
    }
  }
  else {
    closedir((DIR *)e->dp);
    del234((tree234 *)srv[-3].vt,e);
    safefree(e);
    fxp_reply_ok(reply);
  }
  return;
}

Assistant:

static void uss_close(SftpServer *srv, SftpReplyBuilder *reply,
                      ptrlen handle)
{
    UnixSftpServer *uss = container_of(srv, UnixSftpServer, srv);
    int fd;
    struct uss_dirhandle *udh;

    if ((udh = uss_try_lookup_dirhandle(uss, handle)) != NULL) {
        closedir(udh->dp);
        del234(uss->dirhandles, udh);
        sfree(udh);
        fxp_reply_ok(reply);
    } else if ((fd = uss_lookup_fd(uss, reply, handle)) >= 0) {
        close(fd);
        assert(0 <= fd && fd <= uss->fdsize);
        uss->fdsopen[fd] = false;
        fxp_reply_ok(reply);
    }
    /* if both failed, uss_lookup_fd will have filled in an error response */
}